

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

bool __thiscall wallet::LegacyDataSPKM::LoadCScript(LegacyDataSPKM *this,CScript *redeemScript)

{
  uint uVar1;
  uint parameters_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_3;
  bool bVar2;
  long in_FS_OFFSET;
  string strAddr;
  undefined8 in_stack_ffffffffffffff28;
  undefined1 *puVar3;
  undefined8 in_stack_ffffffffffffff38;
  long in_stack_ffffffffffffff40;
  ScriptHash local_ac;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_98;
  undefined1 local_50;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((redeemScript->super_CScriptBase)._size < 0x226) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      bVar2 = FillableSigningProvider::AddCScript(&this->super_FillableSigningProvider,redeemScript)
      ;
      return bVar2;
    }
  }
  else {
    ScriptHash::ScriptHash(&local_ac,redeemScript);
    local_98._M_first._M_storage._M_storage[0x10] =
         local_ac.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x10];
    local_98._M_first._M_storage._M_storage[0x11] =
         local_ac.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x11];
    local_98._M_first._M_storage._M_storage[0x12] =
         local_ac.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x12];
    local_98._M_first._M_storage._M_storage[0x13] =
         local_ac.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x13];
    local_98._M_first._M_storage._M_storage[0] =
         local_ac.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0];
    local_98._M_first._M_storage._M_storage[1] =
         local_ac.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[1];
    local_98._M_first._M_storage._M_storage[2] =
         local_ac.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[2];
    local_98._M_first._M_storage._M_storage[3] =
         local_ac.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[3];
    local_98._M_first._M_storage._M_storage[4] =
         local_ac.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[4];
    local_98._M_first._M_storage._M_storage[5] =
         local_ac.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[5];
    local_98._M_first._M_storage._M_storage[6] =
         local_ac.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[6];
    local_98._M_first._M_storage._M_storage[7] =
         local_ac.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[7];
    local_98._M_first._M_storage._M_storage[8] =
         local_ac.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[8];
    local_98._M_first._M_storage._M_storage[9] =
         local_ac.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[9];
    local_98._M_first._M_storage._M_storage[10] =
         local_ac.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[10];
    local_98._M_first._M_storage._M_storage[0xb] =
         local_ac.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xb];
    local_98._M_first._M_storage._M_storage[0xc] =
         local_ac.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xc];
    local_98._M_first._M_storage._M_storage[0xd] =
         local_ac.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xd];
    local_98._M_first._M_storage._M_storage[0xe] =
         local_ac.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xe];
    local_98._M_first._M_storage._M_storage[0xf] =
         local_ac.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xf];
    local_50 = 3;
    EncodeDestination_abi_cxx11_(&local_48,(CTxDestination *)&local_98._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&local_98._M_first);
    uVar1 = (redeemScript->super_CScriptBase)._size;
    puVar3 = &stack0xffffffffffffff40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&stack0xffffffffffffff30,local_48._M_dataplus._M_p,
               local_48._M_dataplus._M_p + local_48._M_string_length);
    parameters_1 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      parameters_1 = uVar1;
    }
    parameters_3._M_string_length = (size_type)puVar3;
    parameters_3._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff28;
    parameters_3.field_2._M_allocated_capacity = in_stack_ffffffffffffff38;
    parameters_3.field_2._8_8_ = in_stack_ffffffffffffff40;
    wallet::ScriptPubKeyMan::
    WalletLogPrintf<char_const*,unsigned_int,unsigned_int,std::__cxx11::string>
              (&this->super_ScriptPubKeyMan,
               "%s: Warning: This wallet contains a redeemScript of size %i which exceeds maximum size %i thus can never be redeemed. Do not use address %s.\n"
               ,"LoadCScript",parameters_1,0x208,parameters_3);
    if (puVar3 != &stack0xffffffffffffff40) {
      operator_delete(puVar3,in_stack_ffffffffffffff40 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return true;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyDataSPKM::LoadCScript(const CScript& redeemScript)
{
    /* A sanity check was added in pull #3843 to avoid adding redeemScripts
     * that never can be redeemed. However, old wallets may still contain
     * these. Do not add them to the wallet and warn. */
    if (redeemScript.size() > MAX_SCRIPT_ELEMENT_SIZE)
    {
        std::string strAddr = EncodeDestination(ScriptHash(redeemScript));
        WalletLogPrintf("%s: Warning: This wallet contains a redeemScript of size %i which exceeds maximum size %i thus can never be redeemed. Do not use address %s.\n", __func__, redeemScript.size(), MAX_SCRIPT_ELEMENT_SIZE, strAddr);
        return true;
    }

    return FillableSigningProvider::AddCScript(redeemScript);
}